

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O2

void __thiscall
ZXing::Result::Result
          (Result *this,DecoderResult *decodeResult,DetectorResult *detectorResult,
          BarcodeFormat format)

{
  PointT<int> PVar1;
  PointT<int> PVar2;
  PointT<int> PVar3;
  
  Content::Content(&this->_content,&decodeResult->_content);
  Error::Error(&this->_error,&decodeResult->_error);
  PVar1 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
  PVar2 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
  PVar3 = (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
       (detectorResult->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PVar3;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar1;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] = PVar2;
  ReaderOptions::ReaderOptions(&this->_readerOpts);
  StructuredAppendInfo::StructuredAppendInfo(&this->_sai,&decodeResult->_structuredAppend);
  this->_format = format;
  this->_ecLevel[0] = '\0';
  this->_ecLevel[1] = '\0';
  this->_ecLevel[2] = '\0';
  this->_ecLevel[3] = '\0';
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  this->_version[3] = '\0';
  this->_lineCount = decodeResult->_lineCount;
  this->_isMirrored = decodeResult->_isMirrored;
  this->_isInverted = false;
  this->_readerInit = decodeResult->_readerInit;
  if (decodeResult->_versionNumber != 0) {
    snprintf(this->_version,4,"%d");
  }
  snprintf(this->_ecLevel,4,"%s",(decodeResult->_ecLevel)._M_dataplus._M_p);
  return;
}

Assistant:

Result::Result(DecoderResult&& decodeResult, DetectorResult&& detectorResult, BarcodeFormat format)
	: _content(std::move(decodeResult).content()),
	  _error(std::move(decodeResult).error()),
	  _position(std::move(detectorResult).position()),
	  _sai(decodeResult.structuredAppend()),
	  _format(format),
	  _lineCount(decodeResult.lineCount()),
	  _isMirrored(decodeResult.isMirrored()),
	  _readerInit(decodeResult.readerInit())
#ifdef ZXING_EXPERIMENTAL_API
	  , _symbol(std::make_shared<BitMatrix>(std::move(detectorResult).bits()))
#endif
{
	if (decodeResult.versionNumber())
		snprintf(_version, 4, "%d", decodeResult.versionNumber());
	snprintf(_ecLevel, 4, "%s", decodeResult.ecLevel().data());

	// TODO: add type opaque and code specific 'extra data'? (see DecoderResult::extra())
}